

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Function<kj::MainBuilder::Validity_()> * __thiscall
kj::Arena::
allocate<kj::Function<kj::MainBuilder::Validity()>,kj::Function<kj::MainBuilder::Validity()>>
          (Arena *this,Function<kj::MainBuilder::Validity_()> *params)

{
  Function<kj::MainBuilder::Validity_()> *ptr;
  
  ptr = (Function<kj::MainBuilder::Validity_()> *)allocateBytes(this,0x10,8,true);
  (ptr->impl).disposer = (params->impl).disposer;
  (ptr->impl).ptr = (params->impl).ptr;
  (params->impl).ptr = (Iface *)0x0;
  setDestructor(this,ptr,destroyObject<kj::Function<kj::MainBuilder::Validity()>>);
  return ptr;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}